

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O2

int __thiscall
FResourceFile::FilterLumps
          (FResourceFile *this,FString *filtername,void *lumps,size_t lumpsize,DWORD max)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FString *pFVar4;
  FResourceLump *pFVar5;
  FResourceFile *pFVar6;
  ulong uVar7;
  uint uVar8;
  FString filter;
  DWORD start;
  DWORD end;
  FResourceFile *local_58;
  FResourceLump *local_50;
  FResourceLump *local_48;
  FString local_40;
  FString local_38;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  filter.Chars = FString::NullString.Nothing;
  if (*(int *)(filtername->Chars + -0xc) == 0) {
    uVar8 = 0;
  }
  else {
    pFVar4 = FString::operator+=(&filter,"filter/");
    pFVar4 = FString::operator+=(pFVar4,filtername);
    FString::operator+=(pFVar4,'/');
    pFVar6 = (FResourceFile *)&local_38;
    FString::AttachToOther((FString *)pFVar6,&filter);
    bVar2 = FindPrefixRange(pFVar6,&local_38,lumps,lumpsize,max,&start,&end);
    FString::~FString(&local_38);
    if (bVar2) {
      uVar7 = (ulong)start;
      pFVar5 = (FResourceLump *)(uVar7 * lumpsize + (long)lumps);
      local_58 = this;
      local_50 = (FResourceLump *)lumps;
      local_48 = pFVar5;
      while( true ) {
        if (end <= (uint)uVar7) break;
        iVar3 = FString::CompareNoCase(&pFVar5->FullName,&filter,*(int *)(filter.Chars + -0xc));
        if (iVar3 != 0) {
          __assert_fail("lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                        ,0x188,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
        }
        FString::Mid(&local_40,(size_t)&pFVar5->FullName,(ulong)*(uint *)(filter.Chars + -0xc));
        FResourceLump::LumpNameSetup(pFVar5,&local_40);
        FString::~FString(&local_40);
        uVar7 = (ulong)((uint)uVar7 + 1);
        pFVar5 = (FResourceLump *)((long)&pFVar5->_vptr_FResourceLump + lumpsize);
      }
      uVar8 = end - start;
      uVar7 = uVar8 * lumpsize;
      uVar1 = local_58->NumLumps;
      local_50 = (FResourceLump *)((long)local_50 + (uVar1 * lumpsize - uVar7));
      if (local_50 < local_48) {
        __assert_fail("to >= from",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                      ,399,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
      }
      if (local_50 != local_48) {
        local_58 = (FResourceFile *)operator_new__(uVar7);
        pFVar5 = local_48;
        memcpy(local_58,local_48,uVar7);
        memmove(pFVar5,(_func_int ***)((long)&pFVar5->_vptr_FResourceLump + uVar7),
                (uVar1 - end) * lumpsize);
        pFVar6 = local_58;
        memcpy(local_50,local_58,uVar7);
        operator_delete__(pFVar6);
      }
    }
    else {
      uVar8 = end - start;
    }
  }
  FString::~FString(&filter);
  return uVar8;
}

Assistant:

int FResourceFile::FilterLumps(FString filtername, void *lumps, size_t lumpsize, DWORD max)
{
	FString filter;
	DWORD start, end;

	if (filtername.IsEmpty())
	{
		return 0;
	}
	filter << "filter/" << filtername << '/';
	if (FindPrefixRange(filter, lumps, lumpsize, max, start, end))
	{
		void *from = (BYTE *)lumps + start * lumpsize;

		// Remove filter prefix from every name
		void *lump_p = from;
		for (DWORD i = start; i < end; ++i, lump_p = (BYTE *)lump_p + lumpsize)
		{
			FResourceLump *lump = (FResourceLump *)lump_p;
			assert(lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0);
			lump->LumpNameSetup(lump->FullName.Mid(filter.Len()));
		}

		// Move filtered lumps to the end of the lump list.
		size_t count = (end - start) * lumpsize;
		void *to = (BYTE *)lumps + NumLumps * lumpsize - count;
		assert (to >= from);

		if (from != to)
		{
			// Copy filtered lumps to a temporary buffer.
			BYTE *filteredlumps = new BYTE[count];
			memcpy(filteredlumps, from, count);

			// Shift lumps left to make room for the filtered ones at the end.
			memmove(from, (BYTE *)from + count, (NumLumps - end) * lumpsize);

			// Copy temporary buffer to newly freed space.
			memcpy(to, filteredlumps, count);

			delete[] filteredlumps;
		}
	}
	return end - start;
}